

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<const_ON_Font_*>::Append
          (ON_SimpleArray<const_ON_Font_*> *this,int count,ON_Font **buffer)

{
  int iVar1;
  ON_Font **__dest;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sz;
  
  if (buffer != (ON_Font **)0x0 && 0 < count) {
    sz = (ulong)(uint)count << 3;
    iVar1 = this->m_count;
    uVar4 = iVar1 + count;
    if (this->m_capacity < (int)uVar4) {
      if (iVar1 < 8 || (ulong)((long)iVar1 * 8) < 0x10000001) {
        uVar3 = 4;
        if (2 < iVar1) {
          uVar3 = iVar1 * 2;
        }
      }
      else {
        iVar2 = 0x2000008;
        if (iVar1 < 0x2000008) {
          iVar2 = iVar1;
        }
        uVar3 = iVar2 + iVar1;
      }
      if ((int)uVar4 < (int)uVar3) {
        uVar4 = uVar3;
      }
      if (buffer < this->m_a + this->m_capacity && this->m_a <= buffer) {
        __dest = (ON_Font **)onmalloc(sz);
        memcpy(__dest,buffer,sz);
        buffer = __dest;
      }
      else {
        __dest = (ON_Font **)0x0;
      }
      if ((uint)this->m_capacity < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
    }
    else {
      __dest = (ON_Font **)0x0;
    }
    memcpy(this->m_a + this->m_count,buffer,sz);
    if (__dest != (ON_Font **)0x0) {
      onfree(__dest);
    }
    this->m_count = this->m_count + count;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }
    memcpy( (void*)(m_a + m_count), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count += count;
  }
}